

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O0

void __thiscall
Js::DelayedFreeArrayBuffer::ScanStack
          (DelayedFreeArrayBuffer *this,void **stackTop,size_t byteCount,void **registers,
          size_t registersByteCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_8_1_8991fb9c local_38;
  anon_class_8_1_8991fb9c BufferFreeFunction;
  size_t registersByteCount_local;
  void **registers_local;
  size_t byteCount_local;
  void **stackTop_local;
  DelayedFreeArrayBuffer *this_local;
  
  BufferFreeFunction.this = (DelayedFreeArrayBuffer *)registersByteCount;
  bVar2 = HasAnyItem(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x48,"(HasAnyItem())","HasAnyItem()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ResetToNoMarkObject(this);
  local_38.this = this;
  ScanStack::anon_class_8_1_8991fb9c::operator()
            (&local_38,registers,(size_t)BufferFreeFunction.this);
  ScanStack::anon_class_8_1_8991fb9c::operator()(&local_38,stackTop,byteCount);
  ReleaseOnlyNonMarkedObject(this);
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ScanStack(void ** stackTop, size_t byteCount, void ** registers, size_t registersByteCount)
    {
        AssertOrFailFast(HasAnyItem());
        ResetToNoMarkObject();

        auto BufferFreeFunction = [&](void ** obj, size_t byteCount)
        {
            Assert(byteCount != 0);
            Assert(byteCount % sizeof(void *) == 0);

            void ** objEnd = obj + (byteCount / sizeof(void *));

            do
            {
                // We need to ensure that the compiler does not reintroduce reads to the object after inlining.
                // This could cause the value to change after the marking checks (e.g., the null/low address check).
                // Intrinsics avoid the expensive memory barrier on ARM (due to /volatile:ms).
#if defined(_M_ARM64)
                void * candidate = reinterpret_cast<void *>(__iso_volatile_load64(reinterpret_cast<volatile __int64 *>(obj)));
#elif defined(_M_ARM)
                void * candidate = reinterpret_cast<void *>(__iso_volatile_load32(reinterpret_cast<volatile __int32 *>(obj)));
#else
                void * candidate = *(static_cast<void * volatile *>(obj));
#endif
                CheckAndMarkObject(candidate);
                obj++;
            } while (obj != objEnd);

        };

        BufferFreeFunction(registers, registersByteCount);
        BufferFreeFunction(stackTop, byteCount);

        ReleaseOnlyNonMarkedObject();
    }